

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_app.cpp
# Opt level: O0

ssize_t __thiscall Clasp::Cli::WriteCnf::write(WriteCnf *this,int __fd,void *__buf,size_t __n)

{
  FILE *__stream;
  uint uVar1;
  int iVar2;
  iterator pLVar3;
  undefined4 extraout_var;
  undefined4 in_register_00000034;
  const_iterator end;
  const_iterator it;
  iterator local_18;
  
  bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::clear(&this->lits_);
  (**(code **)(*(long *)CONCAT44(in_register_00000034,__fd) + 0xa0))
            ((long *)CONCAT44(in_register_00000034,__fd),&this->lits_);
  local_18 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::begin
                       (&this->lits_);
  pLVar3 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::end(&this->lits_);
  for (; local_18 != pLVar3; local_18 = local_18 + 1) {
    __stream = (FILE *)this->str_;
    uVar1 = toInt((Literal)0x0);
    fprintf(__stream,"%d ",(ulong)uVar1);
  }
  iVar2 = fprintf((FILE *)this->str_,"%d\n",0);
  return CONCAT44(extraout_var,iVar2);
}

Assistant:

void WriteCnf::write(ClauseHead* h) {
	lits_.clear();
	h->toLits(lits_);
	for (LitVec::const_iterator it = lits_.begin(), end = lits_.end(); it != end; ++it) {
		fprintf(str_, "%d ", toInt(*it));
	}
	fprintf(str_, "%d\n", 0);
}